

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_os_getcwd(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  char *pcVar1;
  JSValue JVar2;
  int err;
  char buf [4096];
  char local_1038 [12];
  int in_stack_ffffffffffffefd4;
  char *in_stack_ffffffffffffefd8;
  JSContext *in_stack_ffffffffffffefe0;
  
  pcVar1 = getcwd(local_1038,0x1000);
  if (pcVar1 == (char *)0x0) {
    local_1038[0] = '\0';
    __errno_location();
  }
  JVar2 = make_string_error(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8,
                            in_stack_ffffffffffffefd4);
  return JVar2;
}

Assistant:

static JSValue js_os_getcwd(JSContext *ctx, JSValueConst this_val,
                            int argc, JSValueConst *argv)
{
    char buf[PATH_MAX];
    int err;
    
    if (!getcwd(buf, sizeof(buf))) {
        buf[0] = '\0';
        err = errno;
    } else {
        err = 0;
    }
    return make_string_error(ctx, buf, err);
}